

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall
icu_63::GregorianCalendar::handleComputeFields
          (GregorianCalendar *this,int32_t julianDay,UErrorCode *status)

{
  uint uVar1;
  uint eyear;
  int32_t iVar2;
  int iVar3;
  int32_t iVar4;
  int iVar5;
  int16_t *piVar6;
  int iVar7;
  int iVar8;
  int32_t iVar9;
  bool bVar10;
  int32_t unusedRemainder;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  iVar5 = this->fCutoverJulianDay;
  if (julianDay < iVar5) {
    eyear = ClockMath::floorDivide
                      ((double)(julianDay + -0x1a4450) * 4.0 + 1464.0,0x5b5,&unusedRemainder);
    iVar2 = ClockMath::floorDivide(eyear - 1,4);
    iVar5 = (eyear - 1) * -0x16d;
    iVar8 = (julianDay + -0x1a4450) - iVar2;
    iVar7 = iVar5 + iVar8;
    bVar10 = (eyear & 3) == 0;
    uVar1 = (uint)bVar10;
    piVar6 = kNumDays;
    if (bVar10) {
      piVar6 = kLeapNumDays;
    }
    iVar3 = 0;
    if ((int)(uVar1 + 0x3b) <= iVar7) {
      iVar3 = 2 - uVar1;
    }
    iVar3 = ((iVar3 + iVar7) * 0xc + 6) / 0x16f;
    iVar2 = (iVar7 - piVar6[iVar3]) + 1;
    iVar9 = iVar8 + iVar5 + 1;
    iVar5 = this->fCutoverJulianDay;
  }
  else {
    eyear = (this->super_Calendar).fGregorianYear;
    iVar3 = (this->super_Calendar).fGregorianMonth;
    iVar2 = (this->super_Calendar).fGregorianDayOfMonth;
    iVar9 = (this->super_Calendar).fGregorianDayOfYear;
  }
  if ((eyear == this->fGregorianCutoverYear) && (iVar5 <= julianDay)) {
    iVar4 = Grego::gregorianShift(eyear);
    iVar9 = iVar9 + iVar4;
  }
  (this->super_Calendar).fFields[2] = iVar3;
  (this->super_Calendar).fStamp[2] = 1;
  (this->super_Calendar).fIsSet[2] = '\x01';
  (this->super_Calendar).fFields[5] = iVar2;
  (this->super_Calendar).fStamp[5] = 1;
  (this->super_Calendar).fStamp[6] = 1;
  (this->super_Calendar).fIsSet[5] = '\x01';
  (this->super_Calendar).fIsSet[6] = '\x01';
  (this->super_Calendar).fFields[6] = iVar9;
  (this->super_Calendar).fFields[0x13] = eyear;
  (this->super_Calendar).fStamp[0x13] = 1;
  (this->super_Calendar).fIsSet[0x13] = '\x01';
  uVar1 = 1 - eyear;
  if (0 < (int)eyear) {
    uVar1 = eyear;
  }
  (this->super_Calendar).fFields[0] = (uint)(0 < (int)eyear);
  (this->super_Calendar).fStamp[0] = 1;
  (this->super_Calendar).fStamp[1] = 1;
  (this->super_Calendar).fIsSet[0] = '\x01';
  (this->super_Calendar).fIsSet[1] = '\x01';
  (this->super_Calendar).fFields[1] = uVar1;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }